

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

handle pybind11::detail::
       tuple_caster<std::pair,std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
       ::
       cast_impl<std::pair<std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>,0ul,1ul>
                 (vector<double,_std::allocator<double>_> *src,return_value_policy policy,
                 handle parent)

{
  undefined8 uVar1;
  handle hVar2;
  array<pybind11::object,_2UL> *__range3;
  long lVar3;
  array<pybind11::object,_2UL> entries;
  tuple result;
  object local_38;
  PyObject *local_30;
  handle local_28;
  
  hVar2 = list_caster<std::vector<double,std::allocator<double>>,double>::
          cast<std::vector<double,std::allocator<double>>>(src,policy,parent);
  local_38.super_handle = hVar2;
  local_30 = (PyObject *)
             list_caster<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>,Eigen::Matrix<double,1,2,1,1,2>>
             ::
             cast<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
                       ((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                         *)(src + 1),policy,parent);
  if (local_30 == (PyObject *)0x0 || hVar2.m_ptr == (PyObject *)0x0) {
    hVar2.m_ptr = (PyObject *)0x0;
  }
  else {
    tuple::tuple((tuple *)&local_28,2);
    hVar2.m_ptr = local_28.m_ptr;
    lVar3 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&local_38.super_handle.m_ptr + lVar3);
      *(undefined8 *)((long)&local_38.super_handle.m_ptr + lVar3) = 0;
      if (((local_28.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
        __assert_fail("PyTuple_Check(result.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/cast.h"
                      ,0x588,
                      "static handle pybind11::detail::tuple_caster<std::pair, std::vector<double>, std::vector<Eigen::Matrix<double, 1, 2>>>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::pair, Ts = <std::vector<double>, std::vector<Eigen::Matrix<double, 1, 2>>>, T = std::pair<std::vector<double>, std::vector<Eigen::Matrix<double, 1, 2>>>, Is = <0UL, 1UL>]"
                     );
      }
      *(undefined8 *)((long)&local_28.m_ptr[1].ob_type + lVar3) = uVar1;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x10);
    local_28.m_ptr = (PyObject *)0x0;
    object::~object((object *)&local_28);
  }
  lVar3 = 8;
  do {
    object::~object((object *)((long)&local_38.super_handle.m_ptr + lVar3));
    lVar3 = lVar3 + -8;
  } while (lVar3 != -8);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }